

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh.cpp
# Opt level: O2

int __thiscall ncnn::TanH::forward_inplace(TanH *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  int i;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int c;
  float fVar6;
  Mat local_68;
  
  uVar4 = bottom_top_blob->h * bottom_top_blob->w;
  uVar2 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar2;
  }
  iVar3 = bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    iVar3 = 0;
  }
  while (c = (int)uVar2, c != iVar3) {
    Mat::channel(&local_68,bottom_top_blob,c);
    pvVar1 = local_68.data;
    Mat::~Mat(&local_68);
    for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      fVar6 = tanhf(*(float *)((long)pvVar1 + uVar2 * 4));
      *(float *)((long)pvVar1 + uVar2 * 4) = fVar6;
    }
    uVar2 = (ulong)(c + 1);
  }
  return 0;
}

Assistant:

int TanH::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            ptr[i] = tanh(ptr[i]);
        }
    }

    return 0;
}